

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

Logout * anon_unknown.dwarf_334836::createLogout
                   (Logout *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  FieldBase local_80;
  
  FIX42::Logout::Logout(__return_storage_ptr__);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_80,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_80,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  return __return_storage_ptr__;
}

Assistant:

FIX42::Logout createLogout(const char *sender, const char *target, int seq) {
  FIX42::Logout logout;
  fillHeader(logout.getHeader(), sender, target, seq);
  logout.getHeader().setField(BodyLength(logout.bodyLength()));
  logout.getTrailer().setField(CheckSum(logout.checkSum()));
  return logout;
}